

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

int run_test_fork_signal_to_child(void)

{
  int iVar1;
  uint __pid;
  __pid_t __pid_00;
  undefined8 uVar2;
  ssize_t sVar3;
  ulong unaff_RBX;
  char sync_buf [1];
  int sync_pipe [2];
  uv_signal_t signal_handle;
  undefined1 uStack_169;
  int iStack_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  undefined1 auStack_158 [152];
  code *pcStack_c0;
  undefined1 local_a9;
  int local_a8;
  int local_a4;
  undefined1 local_a0 [152];
  
  fork_signal_cb_called = 0;
  pcStack_c0 = (code *)0x157c10;
  iVar1 = pipe(&local_a8);
  if (iVar1 == 0) {
    pcStack_c0 = (code *)0x157c1d;
    run_timer_loop_once();
    pcStack_c0 = (code *)0x157c22;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x157c2f;
    iVar1 = uv_signal_init(uVar2,local_a0);
    if (iVar1 != 0) goto LAB_00157db5;
    pcStack_c0 = (code *)0x157c4d;
    iVar1 = uv_signal_start(local_a0,fork_signal_to_child_cb,10);
    if (iVar1 != 0) goto LAB_00157dba;
    pcStack_c0 = (code *)0x157c5a;
    __pid = fork();
    if (__pid != 0) {
      unaff_RBX = (ulong)__pid;
      if (__pid == 0xffffffff) goto LAB_00157dc4;
      pcStack_c0 = (code *)0x157c80;
      sVar3 = read(local_a8,&local_a9,1);
      if (sVar3 != 1) goto LAB_00157dc9;
      pcStack_c0 = (code *)0x157c96;
      iVar1 = kill(__pid,10);
      if (iVar1 != 0) goto LAB_00157dd3;
      pcStack_c0 = (code *)0x157caa;
      puts("Running loop in parent");
      pcStack_c0 = (code *)0x157cb4;
      uv_unref(local_a0);
      pcStack_c0 = (code *)0x157cb9;
      uVar2 = uv_default_loop();
      pcStack_c0 = (code *)0x157cc6;
      iVar1 = uv_run(uVar2,2);
      if (iVar1 != 0) goto LAB_00157ddd;
      if (fork_signal_cb_called == 0) {
        pcStack_c0 = (code *)0x157ce7;
        puts("Waiting for child in parent");
        pcStack_c0 = (code *)0x157cee;
        assert_wait_child(__pid);
LAB_00157d6c:
        pcStack_c0 = (code *)0x157d71;
        unaff_RBX = uv_default_loop();
        pcStack_c0 = (code *)0x157d85;
        uv_walk(unaff_RBX,close_walk_cb,0);
        pcStack_c0 = (code *)0x157d8f;
        uv_run(unaff_RBX,0);
        pcStack_c0 = (code *)0x157d94;
        uVar2 = uv_default_loop();
        pcStack_c0 = (code *)0x157d9c;
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          pcStack_c0 = (code *)0x157da5;
          uv_library_shutdown();
          return 0;
        }
        goto LAB_00157dbf;
      }
      goto LAB_00157de7;
    }
    pcStack_c0 = (code *)0x157cf5;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x157cfd;
    iVar1 = uv_loop_fork(uVar2);
    if (iVar1 != 0) goto LAB_00157dce;
    pcStack_c0 = (code *)0x157d1a;
    sVar3 = write(local_a4,"1",1);
    if (sVar3 != 1) goto LAB_00157dd8;
    pcStack_c0 = (code *)0x157d29;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x157d31;
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 == 0) goto LAB_00157de2;
    pcStack_c0 = (code *)0x157d45;
    puts("Running loop in child");
    pcStack_c0 = (code *)0x157d4a;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x157d57;
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00157dec;
    if (fork_signal_cb_called == 10) goto LAB_00157d6c;
  }
  else {
    pcStack_c0 = (code *)0x157db5;
    run_test_fork_signal_to_child_cold_1();
LAB_00157db5:
    pcStack_c0 = (code *)0x157dba;
    run_test_fork_signal_to_child_cold_2();
LAB_00157dba:
    pcStack_c0 = (code *)0x157dbf;
    run_test_fork_signal_to_child_cold_3();
LAB_00157dbf:
    pcStack_c0 = (code *)0x157dc4;
    run_test_fork_signal_to_child_cold_14();
LAB_00157dc4:
    pcStack_c0 = (code *)0x157dc9;
    run_test_fork_signal_to_child_cold_9();
LAB_00157dc9:
    pcStack_c0 = (code *)0x157dce;
    run_test_fork_signal_to_child_cold_10();
LAB_00157dce:
    pcStack_c0 = (code *)0x157dd3;
    run_test_fork_signal_to_child_cold_4();
LAB_00157dd3:
    pcStack_c0 = (code *)0x157dd8;
    run_test_fork_signal_to_child_cold_11();
LAB_00157dd8:
    pcStack_c0 = (code *)0x157ddd;
    run_test_fork_signal_to_child_cold_5();
LAB_00157ddd:
    pcStack_c0 = (code *)0x157de2;
    run_test_fork_signal_to_child_cold_12();
LAB_00157de2:
    pcStack_c0 = (code *)0x157de7;
    run_test_fork_signal_to_child_cold_8();
LAB_00157de7:
    pcStack_c0 = (code *)0x157dec;
    run_test_fork_signal_to_child_cold_13();
LAB_00157dec:
    pcStack_c0 = (code *)0x157df1;
    run_test_fork_signal_to_child_cold_6();
  }
  pcStack_c0 = run_test_fork_signal_to_child_closed;
  run_test_fork_signal_to_child_cold_7();
  fork_signal_cb_called = 0;
  pcStack_c0 = (code *)unaff_RBX;
  iVar1 = pipe(&iStack_160);
  if (iVar1 == 0) {
    iVar1 = pipe(&iStack_168);
    if (iVar1 != 0) goto LAB_00157f9b;
    run_timer_loop_once();
    uVar2 = uv_default_loop();
    iVar1 = uv_signal_init(uVar2,auStack_158);
    if (iVar1 != 0) goto LAB_00157fa0;
    iVar1 = uv_signal_start(auStack_158,fork_signal_to_child_cb,10);
    if (iVar1 != 0) goto LAB_00157fa5;
    __pid_00 = fork();
    if (__pid_00 == 0) goto LAB_00157faa;
    if (__pid_00 == -1) goto LAB_00157fdd;
    puts("Wating on child in parent");
    sVar3 = read(iStack_160,&uStack_169,1);
    if (sVar3 != 1) goto LAB_00157fe2;
    puts("Parent killing child");
    iVar1 = kill(__pid_00,10);
    if (iVar1 != 0) goto LAB_00157fe7;
    puts("Running loop in parent");
    uv_unref(auStack_158);
    run_timer_loop_once();
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00157fec;
    printf("Signal in parent %d\n",(ulong)(uint)fork_signal_cb_called);
    if (fork_signal_cb_called != 0) goto LAB_00157ff1;
    sVar3 = write(iStack_164,"1",1);
    if (sVar3 != 1) goto LAB_00157ff6;
    puts("Waiting for child in parent");
    assert_wait_child(__pid_00);
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
LAB_00157ffb:
    run_test_fork_signal_to_child_closed_cold_16();
LAB_00158000:
    run_test_fork_signal_to_child_closed_cold_5();
  }
  else {
    run_test_fork_signal_to_child_closed_cold_1();
LAB_00157f9b:
    run_test_fork_signal_to_child_closed_cold_2();
LAB_00157fa0:
    run_test_fork_signal_to_child_closed_cold_3();
LAB_00157fa5:
    run_test_fork_signal_to_child_closed_cold_4();
LAB_00157faa:
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar2);
    if (iVar1 != 0) goto LAB_00158000;
    puts("Checking loop in child");
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 == 0) {
      run_test_fork_signal_to_child_closed_cold_9();
LAB_00157fdd:
      run_test_fork_signal_to_child_closed_cold_10();
LAB_00157fe2:
      run_test_fork_signal_to_child_closed_cold_11();
LAB_00157fe7:
      run_test_fork_signal_to_child_closed_cold_12();
LAB_00157fec:
      run_test_fork_signal_to_child_closed_cold_13();
LAB_00157ff1:
      run_test_fork_signal_to_child_closed_cold_14();
LAB_00157ff6:
      run_test_fork_signal_to_child_closed_cold_15();
      goto LAB_00157ffb;
    }
  }
  puts("Alerting parent in child");
  sVar3 = write(iStack_15c,"1",1);
  if (sVar3 == 1) {
    puts("Waiting on parent in child");
    sVar3 = read(iStack_168,&uStack_169,1);
    if ((int)sVar3 + 1U < 3) {
      if (fork_signal_cb_called == 0) {
        puts("Exiting child ");
        exit(0);
      }
      goto LAB_00158078;
    }
  }
  else {
    run_test_fork_signal_to_child_closed_cold_6();
  }
  run_test_fork_signal_to_child_closed_cold_7();
LAB_00158078:
  run_test_fork_signal_to_child_closed_cold_8();
  _do_fork_fs_events_child(0);
  return 0;
}

Assistant:

TEST_IMPL(fork_signal_to_child) {
  /* A signal handler installed before forking
     is run only in the child when the child is signalled. */
  uv_signal_t signal_handle;
  pid_t child_pid;
  int sync_pipe[2];
  char sync_buf[1];

  fork_signal_cb_called = 0;    /* reset */

  ASSERT(0 == pipe(sync_pipe));

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == uv_signal_init(uv_default_loop(), &signal_handle));
  ASSERT(0 == uv_signal_start(&signal_handle, fork_signal_to_child_cb, SIGUSR1));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(1 == read(sync_pipe[0], sync_buf, 1)); /* wait for child */
    ASSERT(0 == kill(child_pid, SIGUSR1));
    /* Run the loop, make sure we don't get the signal. */
    printf("Running loop in parent\n");
    uv_unref((uv_handle_t*)&signal_handle);
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));
    ASSERT(0 == fork_signal_cb_called);
    printf("Waiting for child in parent\n");
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(1 == write(sync_pipe[1], "1", 1)); /* alert parent */
    /* Get the signal. */
    ASSERT(0 != uv_loop_alive(uv_default_loop()));
    printf("Running loop in child\n");
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
    ASSERT(SIGUSR1 == fork_signal_cb_called);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}